

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O0

int op_test_open(OggOpusFile *_of)

{
  int ret;
  OggOpusFile *_of_local;
  
  if (_of->ready_state == 1) {
    _of_local._4_4_ = op_open2(_of);
    if (_of_local._4_4_ < 0) {
      memset(_of,0,0x3390);
    }
  }
  else {
    _of_local._4_4_ = -0x83;
  }
  return _of_local._4_4_;
}

Assistant:

int op_test_open(OggOpusFile *_of){
  int ret;
  if(OP_UNLIKELY(_of->ready_state!=OP_PARTOPEN))return OP_EINVAL;
  ret=op_open2(_of);
  /*op_open2() will clear this structure on failure.
    Reset its contents to prevent double-frees in op_free().*/
  if(OP_UNLIKELY(ret<0))memset(_of,0,sizeof(*_of));
  return ret;
}